

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerOperation.cpp
# Opt level: O0

void __thiscall ServerOperation::ServerOperation(ServerOperation *this,char *directory)

{
  char *directory_local;
  ServerOperation *this_local;
  
  this->_vptr_ServerOperation = (_func_int **)&PTR___cxa_pure_virtual_0010acb0;
  std::__cxx11::string::string((string *)&this->statusMessage);
  builtin_strncpy(this->USERDIR,"users",6);
  builtin_strncpy(this->SUCCESS,"OK\n",4);
  builtin_strncpy(this->FAILURE,"ERR\n",5);
  builtin_strncpy(this->EXECUTEPENDING,"EP\n",4);
  std::__cxx11::string::operator=((string *)&this->statusMessage,"expecting parameter.\n");
  this->MESSAGEDIR = directory;
  return;
}

Assistant:

ServerOperation::ServerOperation(const char * directory) {
    //nothing has to be done
    statusMessage = "expecting parameter.\n";
    MESSAGEDIR = directory;
}